

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

VisitError<int> * __thiscall
Fixpp::TypedParsingContext<int>::toVisitError
          (VisitError<int> *__return_storage_ptr__,TypedParsingContext<int> *this)

{
  Storage SVar1;
  undefined1 local_48 [48];
  
  if ((this->super_ParsingContext).error.empty_ == false) {
    ErrorKind::ErrorKind((ErrorKind *)local_48,(ErrorKind *)&(this->super_ParsingContext).error);
    Fixpp::result::Result<int,_Fixpp::ErrorKind>::Result
              (__return_storage_ptr__,(Err<Fixpp::ErrorKind> *)local_48);
    std::__cxx11::string::~string((string *)(local_48 + 0x10));
  }
  else {
    SVar1 = (this->resultValue).storage_;
    __return_storage_ptr__->ok_ = true;
    *(Storage *)&(__return_storage_ptr__->storage_).storage_ = SVar1;
    (__return_storage_ptr__->storage_).initialized_ = true;
  }
  return __return_storage_ptr__;
}

Assistant:

VisitError<T> toVisitError() const
        {
            if (hasError())
                return result::Err(error.get());
            return result::Ok(resultValue.get());
        }